

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

string * __thiscall
higan::HttpRequest::GetMethodString_abi_cxx11_(string *__return_storage_ptr__,HttpRequest *this)

{
  allocator<char> local_1a;
  undefined1 local_19;
  HttpRequest *local_18;
  HttpRequest *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (HttpRequest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"ERROR",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  switch(this->method_) {
  case HTTP_REQUEST_UNKNOWN:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"UNKNOWN");
    break;
  case HTTP_REQUEST_GET:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GET");
    break;
  case HTTP_REQUEST_POST:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"POST");
    break;
  case HTTP_REQUEST_PUT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"PUT");
    break;
  case HTTP_REQUEST_DELETE:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"DELETE");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpRequest::GetMethodString() const
{
	std::string result = "ERROR";
	switch (method_)
	{
		case HTTP_REQUEST_UNKNOWN:
			result = "UNKNOWN";
			break;
		case HTTP_REQUEST_GET:
			result = "GET";
			break;
		case HTTP_REQUEST_POST:
			result = "POST";
			break;
		case HTTP_REQUEST_PUT:
			result = "PUT";
			break;
		case HTTP_REQUEST_DELETE:
			result = "DELETE";
			break;
	}

	return result;
}